

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O3

sizes fuse8(size_t n)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  char cVar10;
  bool bVar11;
  void *pvVar12;
  byte bVar13;
  int iVar14;
  void *pvVar15;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  size_t sVar26;
  uint uVar27;
  uint uVar28;
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  ulong __nmemb;
  ulong uVar32;
  ulong uVar33;
  byte bVar34;
  ulong uVar35;
  uint32_t i;
  uint uVar36;
  ulong uVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  sizes sVar45;
  ulong local_110;
  ulong local_e8;
  uint local_c8 [4];
  uint local_b8;
  void *local_b0;
  uint64_t *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  uint local_74;
  size_t local_70;
  ulong local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  iVar25 = 0;
  iVar14 = (int)n;
  if (iVar14 == 0) {
    uVar27 = 3;
    uVar30 = 4;
  }
  else {
    dVar38 = (double)(n & 0xffffffff);
    dVar39 = log(dVar38);
    dVar39 = floor(dVar39 / 1.2029723039923526 + 2.25);
    uVar30 = 0x40000;
    if ((uint)(long)dVar39 < 0x13) {
      uVar30 = 1 << ((byte)(long)dVar39 & 0x1f);
    }
    uVar27 = uVar30 - 1;
    if (iVar14 != 1) {
      dVar39 = log(dVar38);
      dVar39 = 3.4538776394910684 / dVar39 + 0.875;
      if (dVar39 <= 1.125) {
        dVar39 = 1.125;
      }
      dVar38 = round(dVar39 * dVar38);
      iVar25 = (int)(long)dVar38;
    }
  }
  uVar28 = ((uVar30 + (-uVar30 & (iVar25 + uVar30) - 1)) - 1) / uVar30;
  uVar36 = 1;
  if (2 < uVar28) {
    uVar36 = uVar28 - 2;
  }
  __nmemb = (ulong)((uVar36 + 2) * uVar30);
  pvVar15 = calloc(__nmemb,1);
  if (pvVar15 == (void *)0x0) {
    puts("allocation failed");
    sVar21 = 0;
    sVar26 = 0;
  }
  else {
    local_a8 = (uint64_t *)malloc(n * 8);
    auVar42 = _DAT_00104060;
    if (n != 0) {
      lVar24 = n - 1;
      auVar40._8_4_ = (int)lVar24;
      auVar40._0_8_ = lVar24;
      auVar40._12_4_ = (int)((ulong)lVar24 >> 0x20);
      uVar19 = 0;
      auVar40 = auVar40 ^ _DAT_00104060;
      auVar43 = _DAT_00104050;
      do {
        auVar44 = auVar43 ^ auVar42;
        if ((bool)(~(auVar44._4_4_ == auVar40._4_4_ && auVar40._0_4_ < auVar44._0_4_ ||
                    auVar40._4_4_ < auVar44._4_4_) & 1)) {
          local_a8[uVar19] = uVar19;
        }
        if ((auVar44._12_4_ != auVar40._12_4_ || auVar44._8_4_ <= auVar40._8_4_) &&
            auVar44._12_4_ <= auVar40._12_4_) {
          local_a8[uVar19 + 1] = uVar19 + 1;
        }
        uVar19 = uVar19 + 2;
        lVar24 = auVar43._8_8_;
        auVar43._0_8_ = auVar43._0_8_ + 2;
        auVar43._8_8_ = lVar24 + 2;
      } while ((n + 1 & 0xfffffffffffffffe) != uVar19);
    }
    local_74 = uVar36 * uVar30;
    local_b0 = pvVar15;
    pvVar15 = calloc((ulong)(iVar14 + 1),8);
    __ptr = malloc(__nmemb * 4);
    __ptr_00 = calloc(__nmemb,1);
    local_80 = n & 0xffffffff;
    __ptr_01 = malloc(local_80);
    __ptr_02 = calloc(__nmemb,8);
    iVar25 = -0x40;
    do {
      cVar10 = (char)iVar25;
      uVar28 = 1 << (cVar10 + 0x41U & 0x1f);
      iVar25 = iVar25 + 1;
    } while (uVar28 < uVar36);
    uVar19 = (ulong)uVar28;
    __ptr_03 = malloc(uVar19 * 4);
    auVar42._0_4_ = -(uint)((int)((ulong)__ptr >> 0x20) == 0 && (int)__ptr == 0);
    auVar42._4_4_ = -(uint)((int)__ptr_00 == 0 && (int)((ulong)__ptr_00 >> 0x20) == 0);
    auVar42._8_4_ = -(uint)((int)((ulong)__ptr_01 >> 0x20) == 0 && (int)__ptr_01 == 0);
    auVar42._12_4_ = -(uint)((int)__ptr_02 == 0 && (int)((ulong)__ptr_02 >> 0x20) == 0);
    iVar14 = movmskps((int)__ptr_03,auVar42);
    if (((iVar14 == 0) && (pvVar15 != (void *)0x0)) && (__ptr_03 != (void *)0x0)) {
      bVar18 = cVar10 + 0x41;
      *(undefined8 *)((long)pvVar15 + local_80 * 8) = 1;
      local_58 = (ulong)(uint)-iVar25;
      local_70 = __nmemb * 8;
      local_88 = (ulong)uVar30;
      uVar37 = (ulong)(uVar30 * 2);
      local_90 = (ulong)uVar27;
      local_98 = (ulong)(uVar27 & 0x3ffff);
      lVar24 = uVar19 - 1;
      auVar44._8_4_ = (int)lVar24;
      auVar44._0_8_ = lVar24;
      auVar44._12_4_ = (int)((ulong)lVar24 >> 0x20);
      local_80 = uVar19 * 4 + 4 & 0xfffffffffffffff8;
      uVar22 = 0x10a2a556c2d61962;
      uVar19 = 0x6df6b22537d23467;
      iVar25 = 1;
      local_48 = auVar44 ^ _DAT_00104060;
      local_50 = uVar37;
      local_60 = pvVar15;
      local_e8 = n;
      do {
        uVar17 = local_50;
        pvVar12 = local_60;
        auVar42 = _DAT_00104060;
        local_68 = uVar22;
        iVar14 = (int)local_e8;
        uVar30 = 0;
        uVar22 = 0;
        auVar41 = _DAT_00104050;
        do {
          auVar43 = auVar41 ^ auVar42;
          if ((bool)(~(auVar43._4_4_ == local_48._4_4_ && local_48._0_4_ < auVar43._0_4_ ||
                      local_48._4_4_ < auVar43._4_4_) & 1)) {
            *(uint *)((long)__ptr_03 + uVar22) = uVar30 >> (bVar18 & 0x1f);
          }
          if ((auVar43._12_4_ != local_48._12_4_ || auVar43._8_4_ <= local_48._8_4_) &&
              auVar43._12_4_ <= local_48._12_4_) {
            *(uint *)((long)__ptr_03 + uVar22 + 4) = iVar14 + uVar30 >> (bVar18 & 0x1f);
          }
          lVar24 = auVar41._8_8_;
          auVar41._0_8_ = auVar41._0_8_ + 2;
          auVar41._8_8_ = lVar24 + 2;
          uVar22 = uVar22 + 8;
          uVar30 = uVar30 + iVar14 * 2;
        } while (local_80 != uVar22);
        local_110 = 0;
        uVar22 = CONCAT44(0,local_74);
        local_a0 = 0;
        iVar9 = (int)local_88;
        uVar30 = (uint)local_98;
        if (iVar14 == 0) {
LAB_001022a0:
          if (__nmemb != 0) {
            uVar19 = 0;
            uVar17 = 0;
            do {
              *(int *)((long)__ptr + uVar17 * 4) = (int)uVar19;
              uVar27 = (uint)((*(byte *)((long)__ptr_00 + uVar19) & 0xfc) == 4) + (int)uVar17;
              uVar17 = (ulong)uVar27;
              uVar19 = uVar19 + 1;
            } while (__nmemb != uVar19);
            if (uVar27 == 0) {
              local_110 = 0;
            }
            else {
              local_110 = 0;
              do {
                uVar27 = (int)uVar17 - 1;
                uVar17 = (ulong)uVar27;
                uVar19 = (ulong)*(uint *)((long)__ptr + uVar17 * 4);
                bVar29 = *(byte *)((long)__ptr_00 + uVar19);
                if ((bVar29 & 0xfc) == 4) {
                  uVar19 = *(ulong *)((long)__ptr_02 + uVar19 * 8);
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = uVar19;
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = uVar22;
                  local_c8[3] = SUB164(auVar3 * auVar6,8);
                  local_c8[1] = (uint)(uVar19 >> 0x12) & uVar30 ^ local_c8[3] + iVar9;
                  local_c8[2] = (uint)local_90 & (uint)uVar19 ^ (int)uVar37 + local_c8[3];
                  local_b8 = local_c8[1];
                  uVar36 = bVar29 & 3;
                  uVar20 = (ulong)local_c8[(ulong)uVar36 + 1];
                  bVar29 = *(byte *)((long)__ptr_00 + uVar20);
                  bVar13 = (byte)uVar36;
                  *(uint *)((long)__ptr + uVar17 * 4) = local_c8[(ulong)uVar36 + 1];
                  uVar27 = uVar27 + ((bVar29 & 0xfc) == 8);
                  bVar34 = bVar13 - 2;
                  if (bVar13 < 2) {
                    bVar34 = bVar13 + 1;
                  }
                  *(byte *)((long)__ptr_01 + local_110) = bVar13;
                  *(ulong *)((long)pvVar15 + local_110 * 8) = uVar19;
                  puVar1 = (ulong *)((long)__ptr_02 + uVar20 * 8);
                  *puVar1 = *puVar1 ^ uVar19;
                  *(byte *)((long)__ptr_00 + uVar20) = bVar34 ^ bVar29 - 4;
                  uVar17 = (ulong)local_c8[uVar36 + 2];
                  bVar29 = *(byte *)((long)__ptr_00 + uVar17);
                  *(uint *)((long)__ptr + (ulong)uVar27 * 4) = local_c8[uVar36 + 2];
                  bVar13 = (char)(uVar36 + 2) - 3;
                  if ((ulong)uVar36 == 0) {
                    bVar13 = 2;
                  }
                  *(byte *)((long)__ptr_00 + uVar17) = bVar13 ^ bVar29 - 4;
                  puVar1 = (ulong *)((long)__ptr_02 + uVar17 * 8);
                  *puVar1 = *puVar1 ^ uVar19;
                  uVar17 = (ulong)(((bVar29 & 0xfc) == 8) + uVar27);
                  local_110 = (ulong)((int)local_110 + 1);
                }
              } while ((int)uVar17 != 0);
            }
          }
          uVar27 = (uint)local_110;
          if (uVar27 + (int)local_a0 != iVar14) {
            if ((int)local_a0 != 0) {
              local_e8 = binary_fuse_sort_and_remove_dup(local_a8,local_e8 & 0xffffffff);
            }
            memset(pvVar15,0,(local_e8 & 0xffffffff) << 3);
            goto LAB_00102479;
          }
          if (uVar27 != 0) {
            uVar28 = uVar27 - 1;
            do {
              uVar19 = *(ulong *)((long)pvVar15 + (ulong)uVar28 * 8);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar19;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar22;
              local_c8[0] = SUB164(auVar4 * auVar7,8);
              local_c8[1] = (uint)(uVar19 >> 0x12) & uVar30 ^ local_c8[0] + iVar9;
              local_c8[2] = (uint)uVar19 & (uint)local_90 ^ (int)uVar37 + local_c8[0];
              local_c8[3] = local_c8[0];
              uVar17 = (ulong)*(byte *)((long)__ptr_01 + (ulong)uVar28);
              local_b8 = local_c8[1];
              *(byte *)((long)local_b0 + (ulong)local_c8[uVar17]) =
                   (byte)(uVar19 >> 0x20) ^ (byte)uVar19 ^
                   *(byte *)((long)local_b0 + (ulong)local_c8[uVar17 + 1]) ^
                   *(byte *)((long)local_b0 + (ulong)local_c8[uVar17 + 2]);
              uVar28 = uVar28 - 1;
            } while (uVar28 < uVar27);
          }
          free(__ptr);
          free(__ptr_00);
          free(__ptr_01);
          free(__ptr_02);
          free(pvVar15);
          free(__ptr_03);
          goto LAB_00102573;
        }
        uVar20 = local_e8 & 0xffffffff;
        uVar23 = 0;
        do {
          uVar31 = (local_a8[uVar23] + uVar19 >> 0x21 ^ local_a8[uVar23] + uVar19) *
                   -0xae502812aa7333;
          uVar31 = (uVar31 >> 0x21 ^ uVar31) * -0x3b314601e57a13ad;
          uVar31 = uVar31 >> 0x21 ^ uVar31;
          uVar35 = uVar31 >> ((byte)local_58 & 0x3f);
          while( true ) {
            uVar27 = *(uint *)((long)__ptr_03 + uVar35 * 4);
            if (*(long *)((long)pvVar15 + (ulong)uVar27 * 8) == 0) break;
            uVar35 = (ulong)((int)uVar35 + 1U & uVar28 - 1);
          }
          *(ulong *)((long)pvVar15 + (ulong)uVar27 * 8) = uVar31;
          *(uint *)((long)__ptr_03 + uVar35 * 4) = uVar27 + 1;
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar20);
        uVar19 = 0;
        bVar11 = false;
        local_a0 = 0;
        do {
          uVar23 = *(ulong *)((long)pvVar15 + uVar19 * 8);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar23;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar22;
          lVar24 = SUB168(auVar2 * auVar5,8);
          *(char *)((long)__ptr_00 + lVar24) = *(char *)((long)__ptr_00 + lVar24) + '\x04';
          puVar1 = (ulong *)((long)__ptr_02 + lVar24 * 8);
          *puVar1 = *puVar1 ^ uVar23;
          iVar8 = SUB164(auVar2 * auVar5,8);
          uVar16 = (ulong)((uint)(uVar23 >> 0x12) & uVar30 ^ iVar8 + iVar9);
          *(byte *)((long)__ptr_00 + uVar16) = (*(byte *)((long)__ptr_00 + uVar16) ^ 1) + 4;
          puVar1 = (ulong *)((long)__ptr_02 + uVar16 * 8);
          *puVar1 = *puVar1 ^ uVar23;
          uVar32 = (ulong)((uint)local_90 & (uint)uVar23 ^ (int)uVar37 + iVar8);
          bVar29 = *(char *)((long)__ptr_00 + uVar32) + 4;
          uVar37 = *(ulong *)((long)__ptr_02 + uVar32 * 8);
          uVar33 = uVar37 ^ uVar23;
          *(ulong *)((long)__ptr_02 + uVar32 * 8) = uVar33;
          bVar13 = bVar29 ^ 2;
          *(byte *)((long)__ptr_00 + uVar32) = bVar13;
          uVar31 = *(ulong *)((long)__ptr_02 + lVar24 * 8);
          uVar35 = *(ulong *)((long)__ptr_02 + uVar16 * 8);
          if (((uVar33 & uVar31 & uVar35) == 0) &&
             ((((uVar31 == 0 && (*(char *)((long)__ptr_00 + lVar24) == '\b')) ||
               ((uVar35 == 0 && (*(char *)((long)__ptr_00 + uVar16) == '\b')))) ||
              ((uVar37 == uVar23 && (bVar29 == 10)))))) {
            local_a0 = (ulong)((int)local_a0 + 1);
            *(char *)((long)__ptr_00 + lVar24) = *(char *)((long)__ptr_00 + lVar24) + -4;
            *(ulong *)((long)__ptr_02 + lVar24 * 8) = uVar31 ^ uVar23;
            bVar29 = *(byte *)((long)__ptr_00 + uVar16);
            puVar1 = (ulong *)((long)__ptr_02 + uVar16 * 8);
            *puVar1 = *puVar1 ^ uVar23;
            *(byte *)((long)__ptr_00 + uVar16) = (bVar29 ^ 1) - 4;
            bVar13 = (*(byte *)((long)__ptr_00 + uVar32) ^ 2) - 4;
            *(byte *)((long)__ptr_00 + uVar32) = bVar13;
            puVar1 = (ulong *)((long)__ptr_02 + uVar32 * 8);
            *puVar1 = *puVar1 ^ uVar23;
          }
          if (*(byte *)((long)__ptr_00 + lVar24) < 4) {
            bVar11 = true;
          }
          if (*(byte *)((long)__ptr_00 + uVar16) < 4) {
            bVar11 = true;
          }
          if (bVar13 < 4) {
            bVar11 = true;
          }
          uVar19 = uVar19 + 1;
          pvVar15 = local_60;
          uVar37 = local_50;
        } while (uVar20 != uVar19);
        if (!bVar11) goto LAB_001022a0;
        memset(local_60,0,uVar20 << 3);
        pvVar15 = pvVar12;
        uVar37 = uVar17;
LAB_00102479:
        memset(__ptr_00,0,__nmemb);
        memset(__ptr_02,0,local_70);
        uVar22 = local_68 + 0x9e3779b97f4a7c15;
        uVar19 = (uVar22 >> 0x1e ^ uVar22) * -0x40a7b892e31b1a47;
        uVar19 = (uVar19 >> 0x1b ^ uVar19) * -0x6b2fb644ecceee15;
        uVar19 = uVar19 >> 0x1f ^ uVar19;
        iVar25 = iVar25 + 1;
      } while (iVar25 != 0x65);
      memset(local_b0,0xff,__nmemb);
    }
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
    free(pvVar15);
    free(__ptr_03);
    puts("populating failed");
LAB_00102573:
    free(local_a8);
    sVar26 = (__nmemb + 7 >> 3) + 0xc;
    if (__nmemb != 0) {
      uVar19 = 0;
      do {
        sVar26 = (sVar26 + 1) - (ulong)(*(char *)((long)local_b0 + uVar19) == '\0');
        uVar19 = uVar19 + 1;
      } while (__nmemb != uVar19);
    }
    sVar21 = __nmemb + 0x1c;
    free(local_b0);
  }
  sVar45.pack = sVar26;
  sVar45.standard = sVar21;
  return sVar45;
}

Assistant:

sizes fuse8(size_t n) {
  binary_fuse8_t filter = {0};
  if (! binary_fuse8_allocate(n, &filter)) {
    printf("allocation failed\n");
    return (sizes) {0, 0};
  }
  uint64_t* big_set = malloc(n * sizeof(uint64_t));
  for(size_t i = 0; i < n; i++) {
    big_set[i] = i;
  }
  bool is_ok = binary_fuse8_populate(big_set, n, &filter);
  if(! is_ok ) {
    printf("populating failed\n");
  }
  free(big_set);
  sizes s = {
    .standard = binary_fuse8_serialization_bytes(&filter),
    .pack = binary_fuse8_pack_bytes(&filter)
  };
  binary_fuse8_free(&filter);
  return s;
}